

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::SpecialRuntimeObjects::makeSelector(SpecialRuntimeObjects *this,char *string)

{
  VMContext *this_00;
  allocator local_41;
  string local_40;
  char *local_20;
  char *string_local;
  SpecialRuntimeObjects *this_local;
  
  this_00 = this->context;
  local_20 = string;
  string_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,string,&local_41);
  this_local = (SpecialRuntimeObjects *)VMContext::makeSelector(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop SpecialRuntimeObjects::makeSelector(const char *string)
{
    return context->makeSelector(string);
}